

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

ostream * MinVR::operator<<(ostream *os,VRMatrix4 *m)

{
  ostream *poVar1;
  VRMatrix4 *in_RSI;
  ostream *in_RDI;
  float fVar2;
  
  poVar1 = std::operator<<(in_RDI,"[[");
  fVar2 = VRMatrix4::operator()(in_RSI,0,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,0,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,0,2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,0,3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,"], ");
  poVar1 = std::operator<<(poVar1,"[");
  fVar2 = VRMatrix4::operator()(in_RSI,1,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,1,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,1,2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,1,3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,"], ");
  poVar1 = std::operator<<(poVar1,"[");
  fVar2 = VRMatrix4::operator()(in_RSI,2,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,2,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,2,2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,2,3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,"], ");
  poVar1 = std::operator<<(poVar1,"[");
  fVar2 = VRMatrix4::operator()(in_RSI,3,0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,3,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,3,2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,", ");
  fVar2 = VRMatrix4::operator()(in_RSI,3,3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,"]]");
  return poVar1;
}

Assistant:

std::ostream & operator<< ( std::ostream &os, const VRMatrix4 &m) {
  // format:  ((r1c1, r1c2, r1c3, r1c4), (r2c1, r2c2, r2c3, r2c4), etc.. )
  return os << "[[" << m(0,0) << ", " << m(0,1) << ", " << m(0,2) << ", " << m(0,3) << "], "
        << "[" << m(1,0) << ", " << m(1,1) << ", " << m(1,2) << ", " << m(1,3) << "], "
        << "[" << m(2,0) << ", " << m(2,1) << ", " << m(2,2) << ", " << m(2,3) << "], "
        << "[" << m(3,0) << ", " << m(3,1) << ", " << m(3,2) << ", " << m(3,3) << "]]";
}